

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

AllocList * absl::lts_20250127::base_internal::Next(int i,AllocList *prev,Arena *arena)

{
  AllocList *ptr;
  uintptr_t uVar1;
  uintptr_t uVar2;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  char *absl_raw_log_internal_basename_2;
  char *absl_raw_log_internal_basename_1;
  AllocList *next;
  char *absl_raw_log_internal_basename;
  Arena *arena_local;
  AllocList *prev_local;
  int i_local;
  
  if (prev->levels <= i) {
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1c5,"Check %s failed: %s","i < prev->levels",
               "too few levels in Next()");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                  ,0x1c5,
                  "AllocList *absl::base_internal::Next(int, AllocList *, LowLevelAlloc::Arena *)");
  }
  ptr = prev->next[i];
  if (ptr != (AllocList *)0x0) {
    uVar2 = (ptr->header).magic;
    uVar1 = Magic(0xffffffffb37cc16a,&ptr->header);
    if (uVar2 != uVar1) {
      raw_log_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1ca,"Check %s failed: %s",
                 "next->header.magic == Magic(kMagicUnallocated, &next->header)",
                 "bad magic number in Next()");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                    ,0x1ca,
                    "AllocList *absl::base_internal::Next(int, AllocList *, LowLevelAlloc::Arena *)"
                   );
    }
    if ((ptr->header).arena != arena) {
      raw_log_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                 "next->header.arena == arena","bad arena pointer in Next()");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                    ,0x1cb,
                    "AllocList *absl::base_internal::Next(int, AllocList *, LowLevelAlloc::Arena *)"
                   );
    }
    if (prev != &arena->freelist) {
      if (ptr <= prev) {
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x1cd,"Check %s failed: %s","prev < next",
                   "unordered freelist");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                      ,0x1cd,
                      "AllocList *absl::base_internal::Next(int, AllocList *, LowLevelAlloc::Arena *)"
                     );
      }
      if (ptr <= (AllocList *)((long)prev->next + ((prev->header).size - 0x28))) {
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x1d0,"Check %s failed: %s",
                   "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                   ,"malformed freelist",uVar2,"low_level_alloc.cc");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                      ,0x1d0,
                      "AllocList *absl::base_internal::Next(int, AllocList *, LowLevelAlloc::Arena *)"
                     );
      }
    }
  }
  return ptr;
}

Assistant:

static AllocList *Next(int i, AllocList *prev, LowLevelAlloc::Arena *arena) {
  ABSL_RAW_CHECK(i < prev->levels, "too few levels in Next()");
  AllocList *next = prev->next[i];
  if (next != nullptr) {
    ABSL_RAW_CHECK(
        next->header.magic == Magic(kMagicUnallocated, &next->header),
        "bad magic number in Next()");
    ABSL_RAW_CHECK(next->header.arena == arena, "bad arena pointer in Next()");
    if (prev != &arena->freelist) {
      ABSL_RAW_CHECK(prev < next, "unordered freelist");
      ABSL_RAW_CHECK(reinterpret_cast<char *>(prev) + prev->header.size <
                         reinterpret_cast<char *>(next),
                     "malformed freelist");
    }
  }
  return next;
}